

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeDOFSensorVariable
          (BerdyHelper *this,BerdySensorTypes sensorType,DOFIndex idx)

{
  IndexRange IVar1;
  TraversalIndex TVar2;
  Traversal *in_RDX;
  int in_ESI;
  long in_RDI;
  TraversalIndex trvIdx;
  IndexRange ret;
  JointIndex in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  Traversal *local_10;
  
  local_10 = (Traversal *)iDynTree::IndexRange::InvalidRange();
  if (*(int *)(in_RDI + 0x1b0) == 0) {
    TVar2 = getTraversalIndexFromJointIndex
                      ((Model *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_RDX,
                       in_stack_ffffffffffffffd0);
    if (in_ESI == 1000) {
      local_10 = (Traversal *)(*(long *)(in_RDI + 0x2e0) + TVar2 + -1);
    }
    if (in_ESI == 0x3e9) {
      local_10 = (Traversal *)(*(long *)(in_RDI + 0x2e8) + TVar2 + -1);
    }
  }
  else {
    if (in_ESI == 1000) {
      local_10 = in_RDX + *(long *)(in_RDI + 0x2e0);
    }
    if (in_ESI == 0x3e9) {
      local_10 = in_RDX + *(long *)(in_RDI + 0x2e8);
    }
  }
  IVar1.size = 1;
  IVar1.offset = (ptrdiff_t)local_10;
  return IVar1;
}

Assistant:

IndexRange BerdyHelper::getRangeDOFSensorVariable(const BerdySensorTypes sensorType, const DOFIndex idx) const
{
    IndexRange ret = IndexRange::InvalidRange();
    ret.size = 1;

    if (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE)
    {
        // For ORIGINAL_BERDY_FIXED_BASE we know  that DOFIndex is always equalt to JointIndex
        TraversalIndex trvIdx = getTraversalIndexFromJointIndex(m_model,m_dynamicsTraversal,(JointIndex)idx);

        if( sensorType == DOF_ACCELERATION_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofAccelerationOffset + (trvIdx-1);
        }

        if( sensorType == DOF_TORQUE_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofTorquesOffset + (trvIdx-1);
        }
    }
    else
    {
        assert(m_options.berdyVariant == BERDY_FLOATING_BASE);

        if( sensorType == DOF_ACCELERATION_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofAccelerationOffset + idx;
        }

        if( sensorType == DOF_TORQUE_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofTorquesOffset + idx;
        }
    }

    return ret;
}